

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraMan.c
# Opt level: O0

void Fra_ManClean(Fra_Man_t *p,int nNodesMax)

{
  int iVar1;
  int *local_30;
  Vec_Ptr_t **local_28;
  int local_18;
  int nMemAllocNew;
  int i;
  int nNodesMax_local;
  Fra_Man_t *p_local;
  
  for (local_18 = 0; local_18 < p->nMemAlloc; local_18 = local_18 + 1) {
    if ((p->pMemFanins[local_18] != (Vec_Ptr_t *)0x0) &&
       (p->pMemFanins[local_18] != (Vec_Ptr_t *)0x1)) {
      Vec_PtrFree(p->pMemFanins[local_18]);
    }
  }
  if (p->nMemAlloc < nNodesMax) {
    iVar1 = nNodesMax + 5000;
    if (p->pMemFanins == (Vec_Ptr_t **)0x0) {
      local_28 = (Vec_Ptr_t **)malloc((long)iVar1 << 3);
    }
    else {
      local_28 = (Vec_Ptr_t **)realloc(p->pMemFanins,(long)iVar1 << 3);
    }
    p->pMemFanins = local_28;
    if (p->pMemSatNums == (int *)0x0) {
      local_30 = (int *)malloc((long)iVar1 << 2);
    }
    else {
      local_30 = (int *)realloc(p->pMemSatNums,(long)iVar1 << 2);
    }
    p->pMemSatNums = local_30;
    p->nMemAlloc = iVar1;
  }
  memset(p->pMemFanins,0,(long)p->nMemAlloc << 3);
  memset(p->pMemSatNums,0,(long)p->nMemAlloc << 2);
  return;
}

Assistant:

void Fra_ManClean( Fra_Man_t * p, int nNodesMax )
{
    int i;
    // remove old arrays
    for ( i = 0; i < p->nMemAlloc; i++ )
        if ( p->pMemFanins[i] && p->pMemFanins[i] != (void *)1 )
            Vec_PtrFree( p->pMemFanins[i] );
    // realloc for the new size
    if ( p->nMemAlloc < nNodesMax )
    {
        int nMemAllocNew = nNodesMax + 5000;
        p->pMemFanins = ABC_REALLOC( Vec_Ptr_t *, p->pMemFanins, nMemAllocNew );
        p->pMemSatNums = ABC_REALLOC( int, p->pMemSatNums, nMemAllocNew );
        p->nMemAlloc = nMemAllocNew;
    }
    // prepare for the new run
    memset( p->pMemFanins, 0, sizeof(Vec_Ptr_t *) * p->nMemAlloc );
    memset( p->pMemSatNums, 0, sizeof(int) * p->nMemAlloc );
}